

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void mysprint<char,std::char_traits<char>>
               (basic_ostream<char,_std::char_traits<char>_> *os,aiString *vec)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"[length: \'");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\' content: \'");
  poVar1 = std::operator<<(poVar1,vec->data);
  std::operator<<(poVar1,"\']");
  return;
}

Assistant:

void mysprint(std::basic_ostream<char_t, traits_t>& os,  const aiString& vec)   {
    os << "[length: \'" << std::dec << vec.length << "\' content: \'"  << vec.data << "\']";
}